

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<unsigned_int> *getter1,GetterYRef *getter2,bool fit2)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  ImPlotPlot *pIVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  ImPlotRange *pIVar16;
  ImPlotContext *pIVar17;
  bool bVar18;
  int iVar19;
  ImU32 col;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  byte bVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  TransformerLinLin local_84;
  GetterYRef *local_80;
  GetterYs<unsigned_int> *local_78;
  undefined4 local_6c;
  uint local_68;
  uint local_64;
  ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar18 = BeginItem(label_id,1);
  pIVar17 = GImPlot;
  if (bVar18) {
    if (GImPlot->FitThisFrame == true) {
      local_6c = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar19 = getter1->Count;
      if (0 < iVar19) {
        dVar1 = getter1->X0;
        dVar2 = getter1->XScale;
        puVar9 = getter1->Ys;
        iVar3 = getter1->Offset;
        iVar4 = getter1->Stride;
        pIVar10 = GImPlot->CurrentPlot;
        iVar5 = pIVar10->CurrentYAxis;
        uVar6 = (pIVar10->XAxis).Flags;
        pIVar16 = GImPlot->ExtentsY;
        uVar7 = pIVar10->YAxis[iVar5].Flags;
        iVar21 = 0;
        uVar22 = uVar7 & 0x20;
        local_64 = uVar22 >> 5;
        local_68 = uVar6 & 0x20;
        dVar26 = 0.0;
        do {
          dVar27 = dVar2 * dVar26 + dVar1;
          uVar8 = *(uint *)((long)puVar9 +
                           (long)(((iVar3 + iVar21) % iVar19 + iVar19) % iVar19) * (long)iVar4);
          dVar12 = (double)uVar8;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((long)ABS(dVar27) < 0x7ff0000000000000) {
LAB_001e6fba:
              if ((0.0 < dVar27) || (local_68 == 0)) {
                dVar14 = (pIVar17->ExtentsX).Min;
                dVar15 = (pIVar17->ExtentsX).Max;
                uVar24 = -(ulong)(dVar27 < dVar14);
                uVar23 = -(ulong)(dVar15 < dVar27);
                auVar28._0_8_ = (ulong)dVar27 & uVar24;
                auVar28._8_8_ = (ulong)dVar27 & uVar23;
                auVar32._0_8_ = ~uVar24 & (ulong)dVar14;
                auVar32._8_8_ = ~uVar23 & (ulong)dVar15;
                pIVar17->ExtentsX = (ImPlotRange)(auVar32 | auVar28);
              }
            }
          }
          else if ((((long)ABS(dVar27) < 0x7ff0000000000000) &&
                   (pIVar10->YAxis[iVar5].Range.Min <= dVar12)) &&
                  (dVar12 <= pIVar10->YAxis[iVar5].Range.Max)) goto LAB_001e6fba;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((uVar8 != 0) || (uVar22 == 0)) {
LAB_001e703c:
              dVar27 = pIVar16[iVar5].Min;
              dVar14 = pIVar17->ExtentsY[iVar5].Max;
              uVar23 = -(ulong)(dVar12 < dVar27);
              uVar25 = -(ulong)(dVar14 < dVar12);
              uVar24 = (ulong)dVar12 & uVar25;
              auVar29._0_8_ = ~uVar23 & (ulong)dVar27;
              auVar29._8_8_ = ~uVar25 & (ulong)dVar14;
              auVar11._8_4_ = (int)uVar24;
              auVar11._0_8_ = (ulong)dVar12 & uVar23;
              auVar11._12_4_ = (int)(uVar24 >> 0x20);
              pIVar16[iVar5] = (ImPlotRange)(auVar29 | auVar11);
            }
          }
          else if ((((pIVar10->XAxis).Range.Min <= dVar27) && (dVar27 <= (pIVar10->XAxis).Range.Max)
                   ) && ((uVar8 == 0 & (byte)local_64) == 0)) goto LAB_001e703c;
          dVar26 = dVar26 + 1.0;
          iVar21 = iVar21 + 1;
        } while (iVar19 != iVar21);
      }
      if ((fit2) && (iVar19 = getter2->Count, 0 < iVar19)) {
        dVar1 = getter2->X0;
        dVar2 = getter2->YRef;
        dVar26 = getter2->XScale;
        pIVar10 = pIVar17->CurrentPlot;
        iVar3 = pIVar10->CurrentYAxis;
        uVar6 = (pIVar10->XAxis).Flags;
        uVar7 = pIVar10->YAxis[iVar3].Flags;
        pIVar16 = pIVar17->ExtentsY + iVar3;
        bVar20 = dVar2 <= 0.0 & (byte)((uVar7 & 0x20) >> 5);
        dVar12 = 0.0;
        do {
          dVar27 = dVar26 * dVar12 + dVar1;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((long)ABS(dVar27) < 0x7ff0000000000000) {
LAB_001e7169:
              if ((0.0 < dVar27) || ((uVar6 & 0x20) == 0)) {
                dVar14 = (pIVar17->ExtentsX).Min;
                dVar15 = (pIVar17->ExtentsX).Max;
                uVar24 = -(ulong)(dVar27 < dVar14);
                uVar23 = -(ulong)(dVar15 < dVar27);
                auVar30._0_8_ = (ulong)dVar27 & uVar24;
                auVar30._8_8_ = (ulong)dVar27 & uVar23;
                auVar33._0_8_ = ~uVar24 & (ulong)dVar14;
                auVar33._8_8_ = ~uVar23 & (ulong)dVar15;
                pIVar17->ExtentsX = (ImPlotRange)(auVar33 | auVar30);
              }
            }
          }
          else if ((((long)ABS(dVar27) < 0x7ff0000000000000) &&
                   (pIVar10->YAxis[iVar3].Range.Min <= dVar2)) &&
                  (dVar2 <= pIVar10->YAxis[iVar3].Range.Max)) goto LAB_001e7169;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((ulong)ABS(dVar2) < 0x7ff0000000000000 && bVar20 == 0) {
LAB_001e71c5:
              uVar24 = -(ulong)(dVar2 < pIVar16->Min);
              uVar23 = -(ulong)(pIVar16->Max < dVar2);
              auVar31._0_8_ = ~uVar24 & (ulong)pIVar16->Min;
              auVar31._8_8_ = ~uVar23 & (ulong)pIVar16->Max;
              auVar13._8_8_ = (ulong)dVar2 & uVar23;
              auVar13._0_8_ = (ulong)dVar2 & uVar24;
              *pIVar16 = (ImPlotRange)(auVar31 | auVar13);
            }
          }
          else if (((ulong)ABS(dVar2) < 0x7ff0000000000000 && bVar20 == 0) &&
                   (dVar27 <= (pIVar10->XAxis).Range.Max && (pIVar10->XAxis).Range.Min <= dVar27))
          goto LAB_001e71c5;
          dVar12 = dVar12 + 1.0;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar17->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar17->NextItemData).Colors + 1);
      iVar19 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar19]) {
      case 0:
        local_84.YAxis = iVar19;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = iVar19;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = iVar19;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = iVar19;
        ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<unsigned_int>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar17 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar17->NextItemData);
    pIVar17->PreviousItem = pIVar17->CurrentItem;
    pIVar17->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}